

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::StencilParamsAdvancedTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::StencilParamsAdvancedTestInstance>
               *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  StencilOpState _front;
  StencilOpState _front_00;
  StencilOpState _back;
  StencilOpState _back_00;
  DepthStencilBaseCase *this_01;
  mapped_type *ppcVar1;
  long lVar2;
  undefined8 *puVar3;
  DepthStencilState *pDVar4;
  byte bVar5;
  StencilOpState frontState_1;
  StencilOpState backState_1;
  undefined1 local_f0 [8];
  void *pvStack_e8;
  float local_e0 [22];
  StencilOpState backState_2;
  StencilOpState frontState_2;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_48;
  
  bVar5 = 0;
  this_01 = (DepthStencilBaseCase *)operator_new(0x2d0);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_48,&(this->m_shaderPaths)._M_t);
  local_f0 = (undefined1  [8])((ulong)(uint)local_f0._4_4_ << 0x20);
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)local_f0);
  vertexShaderName = *ppcVar1;
  frontState_1.super_VkStencilOpState.failOp = VK_STENCIL_OP_ZERO;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)&frontState_1);
  DynamicState::anon_unknown_0::DepthStencilBaseCase::DepthStencilBaseCase
            (this_01,context,vertexShaderName,*ppcVar1);
  (this_01->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DepthStencilBaseCase_00d29880;
  backState_1.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  this_00 = &this_01->m_data;
  local_f0 = (undefined1  [8])0x3f000000bf000000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  backState_1.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  local_f0 = (undefined1  [8])0x3f0000003f000000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  backState_1.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  local_f0 = (undefined1  [8])0xbf000000bf000000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  backState_1.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  local_f0 = (undefined1  [8])0xbf0000003f000000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  backState_1.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  local_f0 = (undefined1  [8])0x3f800000bf800000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  backState_1.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  local_f0 = (undefined1  [8])0x3f8000003f800000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  backState_1.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  local_f0 = (undefined1  [8])0xbf800000bf800000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  backState_1.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_1);
  local_f0 = (undefined1  [8])0xbf8000003f800000;
  pvStack_e8 = (void *)0x3f8000003f800000;
  local_e0[1] = (float)frontState_1.super_VkStencilOpState.passOp;
  local_e0[0] = (float)frontState_1.super_VkStencilOpState.failOp;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_f0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&frontState_1,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&backState_1,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&frontState_2,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_NOT_EQUAL,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&backState_2,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_NOT_EQUAL,0xffffffff,0xffffffff,0);
  _back.super_VkStencilOpState.passOp = backState_1.super_VkStencilOpState.passOp;
  _back.super_VkStencilOpState.failOp = backState_1.super_VkStencilOpState.failOp;
  _front.super_VkStencilOpState.passOp = frontState_1.super_VkStencilOpState.passOp;
  _front.super_VkStencilOpState.failOp = frontState_1.super_VkStencilOpState.failOp;
  _front.super_VkStencilOpState.depthFailOp = frontState_1.super_VkStencilOpState.depthFailOp;
  _front.super_VkStencilOpState.compareOp = frontState_1.super_VkStencilOpState.compareOp;
  _front.super_VkStencilOpState.compareMask = frontState_1.super_VkStencilOpState.compareMask;
  _front.super_VkStencilOpState.writeMask = frontState_1.super_VkStencilOpState.writeMask;
  _front.super_VkStencilOpState.reference = frontState_1.super_VkStencilOpState.reference;
  _back.super_VkStencilOpState.depthFailOp = backState_1.super_VkStencilOpState.depthFailOp;
  _back.super_VkStencilOpState.compareOp = backState_1.super_VkStencilOpState.compareOp;
  _back.super_VkStencilOpState.compareMask = backState_1.super_VkStencilOpState.compareMask;
  _back.super_VkStencilOpState.writeMask = backState_1.super_VkStencilOpState.writeMask;
  _back.super_VkStencilOpState.reference = backState_1.super_VkStencilOpState.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)local_f0,0,0,VK_COMPARE_OP_NEVER,0,1,_front,_back,0.0,1.0);
  puVar3 = (undefined8 *)local_f0;
  pDVar4 = &this_01->m_depthStencilState_1;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)&pDVar4->super_VkPipelineDepthStencilStateCreateInfo = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pDVar4 = (DepthStencilState *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  _front_00.super_VkStencilOpState.depthFailOp = frontState_2.super_VkStencilOpState.depthFailOp;
  _front_00.super_VkStencilOpState.failOp = frontState_2.super_VkStencilOpState.failOp;
  _front_00.super_VkStencilOpState.passOp = frontState_2.super_VkStencilOpState.passOp;
  _front_00.super_VkStencilOpState.compareOp = frontState_2.super_VkStencilOpState.compareOp;
  _front_00.super_VkStencilOpState.compareMask = frontState_2.super_VkStencilOpState.compareMask;
  _front_00.super_VkStencilOpState.writeMask = frontState_2.super_VkStencilOpState.writeMask;
  _front_00.super_VkStencilOpState.reference = frontState_2.super_VkStencilOpState.reference;
  _back_00.super_VkStencilOpState.depthFailOp = backState_2.super_VkStencilOpState.depthFailOp;
  _back_00.super_VkStencilOpState.failOp = backState_2.super_VkStencilOpState.failOp;
  _back_00.super_VkStencilOpState.passOp = backState_2.super_VkStencilOpState.passOp;
  _back_00.super_VkStencilOpState.compareOp = backState_2.super_VkStencilOpState.compareOp;
  _back_00.super_VkStencilOpState.compareMask = backState_2.super_VkStencilOpState.compareMask;
  _back_00.super_VkStencilOpState.writeMask = backState_2.super_VkStencilOpState.writeMask;
  _back_00.super_VkStencilOpState.reference = backState_2.super_VkStencilOpState.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)local_f0,0,0,VK_COMPARE_OP_NEVER,0,1,_front_00,_back_00,0.0,1.0);
  puVar3 = (undefined8 *)local_f0;
  pDVar4 = &this_01->m_depthStencilState_2;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)&pDVar4->super_VkPipelineDepthStencilStateCreateInfo = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pDVar4 = (DepthStencilState *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  DynamicState::anon_unknown_0::DepthStencilBaseCase::initialize(this_01);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_48);
  return &this_01->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}